

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O0

exr_result_t
exr_attr_float_vector_create(exr_context_t ctxt,exr_attr_float_vector_t *fv,float *arr,int32_t nent)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  exr_attr_float_vector_t *in_RDI;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (exr_attr_float_vector_t *)0x0) {
    eVar1 = 2;
  }
  else if ((in_RSI == 0) || (in_RDX == (void *)0x0)) {
    eVar1 = (**(code **)(in_RDI + 4))(in_RDI,3,"Invalid (NULL) arguments to float vector create");
  }
  else {
    eVar1 = exr_attr_float_vector_init
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
    if ((eVar1 == 0) && (0 < in_ECX)) {
      memcpy(*(void **)(in_RSI + 8),in_RDX,(long)in_ECX << 2);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_float_vector_create (
    exr_context_t            ctxt,
    exr_attr_float_vector_t* fv,
    const float*             arr,
    int32_t                  nent)
{
    exr_result_t rv = EXR_ERR_UNKNOWN;
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!fv || !arr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid (NULL) arguments to float vector create");

    rv = exr_attr_float_vector_init (ctxt, fv, nent);
    if (rv == EXR_ERR_SUCCESS && nent > 0)
        memcpy (
            EXR_CONST_CAST (float*, fv->arr),
            arr,
            (size_t) (nent) * sizeof (float));
    return rv;
}